

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::Draw::InstanceFactory<vkt::Draw::(anonymous_namespace)::SimpleDrawInstanced>::createInstance
          (InstanceFactory<vkt::Draw::(anonymous_namespace)::SimpleDrawInstanced> *this,
          Context *context)

{
  TestInstance *this_00;
  TestSpecBase TStack_88;
  TestSpecBase local_50;
  
  this_00 = (TestInstance *)operator_new(0x1b8);
  TestSpecBase::TestSpecBase(&TStack_88,&this->m_testSpec);
  TestSpecBase::TestSpecBase(&local_50,&TStack_88);
  anon_unknown_9::SimpleDraw::SimpleDraw((SimpleDraw *)this_00,context,&local_50);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_50);
  (((DrawTestsBaseClass *)&this_00->_vptr_TestInstance)->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DrawTestsBaseClass_00bd7d88;
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&TStack_88);
  return this_00;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_testSpec);
	}